

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void autobondrot(FILE *outf,xformDatabase *xdb,abrProbeProc *probeProc,void *probestuff,
                abrAtomListProc *delAtomProc,void *deletestuff,int dumpGoToAtoms)

{
  transformData *ptVar1;
  bool bVar2;
  atom *paVar3;
  double dVar4;
  double torsionScore;
  atom *alst;
  goToRec *g;
  transformData *xform;
  int cursor;
  int overflow;
  void *deletestuff_local;
  abrAtomListProc *delAtomProc_local;
  void *probestuff_local;
  abrProbeProc *probeProc_local;
  xformDatabase *xdb_local;
  FILE *outf_local;
  
  if (xdb != (xformDatabase *)0x0) {
    if (xdb->golist == (goToRec *)0x0) {
      for (xform._0_4_ = 0; (int)xform < xdb->nlevs; xform._0_4_ = (int)xform + 1) {
        ptVar1 = xdb->level[(int)xform];
        ptVar1->currVal = ptVar1->startVal;
        rebuildTmat(ptVar1);
      }
      bVar2 = false;
      xform._0_4_ = xdb->nlevs + -1;
      while (-1 < (int)xform) {
        while (!bVar2) {
          paVar3 = orientedAtoms(xdb);
          dVar4 = runnameAndTorsion(xdb,XFworkBuf,300);
          (*probeProc)(XFworkBuf,dVar4,paVar3,probestuff);
          cleanupListExtras(paVar3,xdb,delAtomProc,deletestuff);
          xform._0_4_ = xdb->nlevs + -1;
          ptVar1 = xdb->level[(int)xform];
          ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
          rebuildTmat(ptVar1);
          if (ptVar1->stepVal <= 0.0) {
            bVar2 = ptVar1->currVal < ptVar1->endVal - 1e-05;
          }
          else {
            bVar2 = ptVar1->endVal + 1e-05 < ptVar1->currVal;
          }
        }
        ptVar1 = xdb->level[(int)xform];
        ptVar1->currVal = ptVar1->startVal;
        rebuildTmat(ptVar1);
        bVar2 = false;
        xform._0_4_ = (int)xform + -1;
        if (-1 < (int)xform) {
          ptVar1 = xdb->level[(int)xform];
          ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
          rebuildTmat(ptVar1);
          if (ptVar1->stepVal <= 0.0) {
            bVar2 = ptVar1->currVal < ptVar1->endVal - 1e-05;
          }
          else {
            bVar2 = ptVar1->endVal + 1e-05 < ptVar1->currVal;
          }
        }
      }
    }
    else {
      for (alst = (atom *)xdb->golist; alst != (atom *)0x0; alst = alst->next) {
        setOrientation(xdb,(goToRec *)alst);
        paVar3 = orientedAtoms(xdb);
        dVar4 = runnameAndTorsion(xdb,XFworkBuf,300);
        if (dumpGoToAtoms != 0) {
          fprintf((FILE *)outf,"REMARK Atoms Rotated To %s\n",XFworkBuf);
          XFdescribeAtomList(outf,paVar3);
        }
        (*probeProc)(XFworkBuf,dVar4,paVar3,probestuff);
        cleanupListExtras(paVar3,xdb,delAtomProc,deletestuff);
      }
    }
  }
  return;
}

Assistant:

void autobondrot(FILE *outf, xformDatabase* xdb,
	       abrProbeProc    probeProc,   void *probestuff,
	       abrAtomListProc delAtomProc, void *deletestuff,
	       int dumpGoToAtoms) 
{/*autobondrot()*/
/*where:  (see probe/autobondrot(...); )
   outf  == stderr
   xdb   == xdb
   probeProc == movingDoCommand
   probestuff == mcis
   delAtomProc == deleteMovingAtom
   deletestuff == mabis
   dumpGoToAtoms == Verbose
*/

   int overflow = FALSE, cursor = 0;
   transformData* xform = NULL;
   goToRec* g = NULL;
   atom* alst = NULL;
   double torsionScore = 0.0;

   if (xdb)
   {
      if (xdb->golist)  /*working from a list of GO statements */
      {/*if using GO statements: specific orientations requested */
         for(g = xdb->golist; g; g = g->next) 
         {
            setOrientation(xdb, g);

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

	    if (dumpGoToAtoms) 
            {
	       fprintf(outf, "REMARK Atoms Rotated To %s\n", XFworkBuf);
	       XFdescribeAtomList(outf, alst);
	    }

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */

            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);
         }
         return; /* can quit when we are done with the 'go to's */
      }/*if using GO statements: specific orientations requested */

      /*else: working from intermixed atoms and transformations */

      /* initialize transformation values */
      for(cursor=0; cursor < xdb->nlevs; cursor++) {
         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);
      }

#define ABR_COMP_EPSILON 0.00001

      overflow = FALSE;
      cursor = xdb->nlevs - 1;
      while(cursor >= 0) 
      {
         while(! overflow) 
         {

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */
 
            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);

            cursor = xdb->nlevs - 1;
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                       ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                       :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }

         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);

         overflow = FALSE;

         if (--cursor >= 0) 
         {
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                      ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                      :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }
      }
   }
}